

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

call_matcher_base<float_&(float_&)> *
trompeloeil::find<float&(float&)>
          (call_matcher_list<float_&(float_&)> *list,call_params_type_t<float_&(float_&)> *p)

{
  int iVar1;
  uint uVar2;
  call_matcher_base<float_&(float_&)> *pcVar3;
  uint uVar4;
  call_matcher_base<float_&(float_&)> *pcVar5;
  
  pcVar3 = (call_matcher_base<float_&(float_&)> *)0x0;
  pcVar5 = (call_matcher_base<float_&(float_&)> *)list;
  uVar4 = 0xffffffff;
  while( true ) {
    do {
      pcVar5 = (call_matcher_base<float_&(float_&)> *)
               (pcVar5->super_list_elem<trompeloeil::call_matcher_base<float_&(float_&)>_>).next;
      if (pcVar5 == (call_matcher_base<float_&(float_&)> *)list) {
        return pcVar3;
      }
      iVar1 = (*(pcVar5->super_list_elem<trompeloeil::call_matcher_base<float_&(float_&)>_>).
                _vptr_list_elem[3])(pcVar5,p);
    } while ((char)iVar1 == '\0');
    uVar2 = (*(pcVar5->super_list_elem<trompeloeil::call_matcher_base<float_&(float_&)>_>).
              _vptr_list_elem[4])(pcVar5);
    if (uVar2 == 0) break;
    if (uVar2 < uVar4 || pcVar3 == (call_matcher_base<float_&(float_&)> *)0x0) {
      pcVar3 = pcVar5;
      uVar4 = uVar2;
    }
  }
  return pcVar5;
}

Assistant:

call_matcher_base <Sig> *
  find(
    call_matcher_list <Sig> &list,
    call_params_type_t <Sig> const &p)
  noexcept
  {
    call_matcher_base<Sig>* first_match = nullptr;
    unsigned lowest_cost = ~0U;
    for (auto& i : list)
    {
      if (i.matches(p))
      {
        unsigned cost = i.sequence_cost();
        if (cost == 0)
        {
          return &i;
        }
        if (!first_match || cost < lowest_cost)
        {
          first_match = &i;
          lowest_cost = cost;
        }
      }
    }
    return first_match;
  }